

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O0

Rational * soplex::LPFreadValue(char **pos,SPxOut *spxout,int lineno)

{
  bool bVar1;
  int iVar2;
  Verbosity VVar3;
  char *pcVar4;
  SPxOut *in_RDX;
  long *in_RSI;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_RDI;
  Verbosity old_verbosity_2;
  exception *e;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  bool has_emptydivisor;
  bool has_exponent;
  bool has_dot;
  bool has_emptyexponent;
  bool has_digits;
  char *t;
  char *s;
  char tmp [8192];
  Rational *value;
  undefined4 in_stack_ffffffffffffdea8;
  int in_stack_ffffffffffffdeac;
  SPxOut *in_stack_ffffffffffffdeb0;
  type *in_stack_ffffffffffffdef8;
  longlong *in_stack_ffffffffffffdf00;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_stack_ffffffffffffdf08;
  undefined4 local_20b4;
  Verbosity local_20b0 [4];
  undefined4 local_20a0;
  Verbosity local_209c;
  char local_2095;
  byte local_2094;
  byte local_2093;
  byte local_2092;
  byte local_2091;
  undefined4 local_2090;
  undefined1 local_2089;
  undefined1 *local_2088;
  char *local_2080;
  undefined1 local_2078 [696];
  char *in_stack_ffffffffffffe240;
  
  local_2080 = (char *)*in_RSI;
  local_2089 = 0;
  local_2090 = 1;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            (in_stack_ffffffffffffdf08,in_stack_ffffffffffffdf00,in_stack_ffffffffffffdef8);
  local_2091 = 0;
  local_2092 = 0;
  local_2093 = 0;
  local_2094 = 0;
  local_2095 = '\0';
  if ((*local_2080 == '+') || (*local_2080 == '-')) {
    local_2080 = local_2080 + 1;
  }
  while( true ) {
    bVar1 = false;
    if ('/' < *local_2080) {
      bVar1 = *local_2080 < ':';
    }
    if (!bVar1) break;
    local_2091 = 1;
    local_2080 = local_2080 + 1;
  }
  if (*local_2080 == '.') {
    local_2093 = 1;
    while( true ) {
      local_2080 = local_2080 + 1;
      bVar1 = false;
      if ('/' < *local_2080) {
        bVar1 = *local_2080 < ':';
      }
      if (!bVar1) break;
      local_2091 = 1;
    }
  }
  iVar2 = tolower((int)*local_2080);
  if (iVar2 == 0x65) {
    local_2094 = 1;
    local_2092 = 1;
    pcVar4 = local_2080 + 1;
    if ((*pcVar4 == '+') || (*pcVar4 == '-')) {
      pcVar4 = local_2080 + 2;
    }
    while( true ) {
      local_2080 = pcVar4;
      bVar1 = false;
      if ('/' < *local_2080) {
        bVar1 = *local_2080 < ':';
      }
      if (!bVar1) break;
      local_2092 = 0;
      pcVar4 = local_2080 + 1;
    }
  }
  if (*local_2080 == '/') {
    local_2095 = '\x01';
    while( true ) {
      local_2080 = local_2080 + 1;
      bVar1 = false;
      if ('/' < *local_2080) {
        bVar1 = *local_2080 < ':';
      }
      if (!bVar1) break;
      local_2095 = '\0';
    }
    if ((((((local_2093 & 1) != 0) || ((local_2094 & 1) != 0)) || (local_2095 != '\0')) ||
        (((*local_2080 == '.' || (*local_2080 == '+')) ||
         ((*local_2080 == '-' || (iVar2 = tolower((int)*local_2080), iVar2 == 0x65)))))) &&
       ((in_RDX != (SPxOut *)0x0 && (VVar3 = SPxOut::getVerbosity(in_RDX), 0 < (int)VVar3)))) {
      local_209c = SPxOut::getVerbosity(in_RDX);
      local_20a0 = 1;
      (*in_RDX->_vptr_SPxOut[2])(in_RDX,&local_20a0);
      operator<<(in_stack_ffffffffffffdeb0,
                 (char *)CONCAT44(in_stack_ffffffffffffdeac,in_stack_ffffffffffffdea8));
      operator<<(in_stack_ffffffffffffdeb0,in_stack_ffffffffffffdeac);
      operator<<(in_stack_ffffffffffffdeb0,
                 (char *)CONCAT44(in_stack_ffffffffffffdeac,in_stack_ffffffffffffdea8));
      (*in_RDX->_vptr_SPxOut[2])(in_RDX,&local_209c);
    }
  }
  if ((((local_2092 & 1) != 0) && (in_RDX != (SPxOut *)0x0)) &&
     (VVar3 = SPxOut::getVerbosity(in_RDX), 0 < (int)VVar3)) {
    local_20b0[0] = SPxOut::getVerbosity(in_RDX);
    local_20b4 = 1;
    (*in_RDX->_vptr_SPxOut[2])(in_RDX,&local_20b4);
    operator<<(in_stack_ffffffffffffdeb0,
               (char *)CONCAT44(in_stack_ffffffffffffdeac,in_stack_ffffffffffffdea8));
    operator<<(in_stack_ffffffffffffdeb0,in_stack_ffffffffffffdeac);
    operator<<(in_stack_ffffffffffffdeb0,
               (char *)CONCAT44(in_stack_ffffffffffffdeac,in_stack_ffffffffffffdea8));
    (*in_RDX->_vptr_SPxOut[2])(in_RDX,local_20b0);
  }
  if ((local_2091 & 1) == 0) {
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)in_stack_ffffffffffffdeb0,
                CONCAT44(in_stack_ffffffffffffdeac,in_stack_ffffffffffffdea8));
  }
  else {
    local_2088 = local_2078;
    while ((char *)*in_RSI != local_2080) {
      *local_2088 = *(undefined1 *)*in_RSI;
      *in_RSI = *in_RSI + 1;
      local_2088 = local_2088 + 1;
    }
    *local_2088 = 0;
    ratFromString(in_stack_ffffffffffffe240);
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)in_stack_ffffffffffffdeb0,
                (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)CONCAT44(in_stack_ffffffffffffdeac,in_stack_ffffffffffffdea8));
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x1a7ec0);
  }
  *in_RSI = (long)local_2080;
  SPxOut::
  debug<soplex::SPxOut,_const_char_(&)[28],_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_&,_0>
            (in_RDX,(char (*) [28])"DLPFRD01 LPFreadValue = {}\n",in_RDI);
  bVar1 = LPFisSpace((int)*(char *)*in_RSI);
  if (bVar1) {
    *in_RSI = *in_RSI + 1;
  }
  return in_RDI;
}

Assistant:

static Rational LPFreadValue(char*& pos, SPxOut* spxout, const int lineno = -1)
{
   assert(LPFisValue(pos));

   char        tmp[SOPLEX_LPF_MAX_LINE_LEN];
   const char* s = pos;
   char*       t;
   Rational        value = 1;
   bool        has_digits = false;
   bool        has_emptyexponent = false;
   bool        has_dot = false;
   bool        has_exponent = false;
   bool        has_emptydivisor = false;

   // 1. sign
   if((*s == '+') || (*s == '-'))
      s++;

   // 2. Digits before the decimal dot
   while((*s >= '0') && (*s <= '9'))
   {
      has_digits = true;
      s++;
   }

   // 3. Decimal dot
   if(*s == '.')
   {
      has_dot = true;
      s++;

      // 4. If there was a dot, possible digit behind it
      while((*s >= '0') && (*s <= '9'))
      {
         has_digits = true;
         s++;
      }
   }

   // 5. Exponent
   if(tolower(*s) == 'e')
   {
      has_exponent = true;
      has_emptyexponent = true;
      s++;

      // 6. Exponent sign
      if((*s == '+') || (*s == '-'))
         s++;

      // 7. Exponent digits
      while((*s >= '0') && (*s <= '9'))
      {
         has_emptyexponent = false;
         s++;
      }
   }

   // 8. Division
   if(*s == '/')
   {
      s++;
      has_emptydivisor = true;

      while((*s >= '0') && (*s <= '9'))
      {
         has_emptydivisor = false;
         s++;
      }

      if(has_dot || has_exponent || has_emptydivisor ||
            (*s == '.') || (*s == '+') || (*s == '-') || (tolower(*s) == 'e'))
      {
         SPX_MSG_WARNING((*spxout), (*spxout) << "WLPFRD03 Warning: In line " << lineno <<
                         ": malformed rational value in LP file\n";)
      }
   }


   assert(s != pos);

   if(has_emptyexponent)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) << "WLPFRD01 Warning: In line " << lineno <<
                      ": found empty exponent in LP file - check for forbidden variable names with initial 'e' or 'E'\n");
   }

   if(!has_digits)
      value = (*pos == '-') ? -1 : 1;
   else
   {
      for(t = tmp; pos != s; pos++)
         *t++ = *pos;

      *t = '\0';

      try
      {
         value = ratFromString(tmp);
      }
      catch(const std::exception& e)
      {
         SPX_MSG_WARNING((*spxout), (*spxout) << "WLPFRD04 Warning: In line " << lineno <<
                         ": malformed rational value in LP file\n");
         std::cerr << e.what() << '\n';
      }
   }

   pos += s - pos;

   assert(pos == s);

   SPxOut::debug(spxout, "DLPFRD01 LPFreadValue = {}\n", value);

   if(LPFisSpace(*pos))
      pos++;

   return value;
}